

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O3

int get_pkcs_padding(uchar *input,size_t input_len,size_t *data_len)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  
  iVar3 = -0x6100;
  if (data_len != (size_t *)0x0 && input != (uchar *)0x0) {
    bVar1 = input[input_len - 1];
    uVar4 = (ulong)bVar1;
    *data_len = input_len - uVar4;
    bVar2 = input_len < uVar4 || uVar4 == 0;
    if (input_len != 0) {
      uVar5 = 0;
      do {
        bVar6 = input[uVar5] ^ bVar1;
        if (uVar5 < input_len - uVar4) {
          bVar6 = 0;
        }
        bVar2 = bVar2 | bVar6;
        uVar5 = uVar5 + 1;
      } while (input_len != uVar5);
    }
    iVar3 = -0x6200;
    if (bVar2 == 0) {
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int get_pkcs_padding( unsigned char *input, size_t input_len,
        size_t *data_len )
{
    size_t i, pad_idx;
    unsigned char padding_len, bad = 0;

    if( NULL == input || NULL == data_len )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

    padding_len = input[input_len - 1];
    *data_len = input_len - padding_len;

    /* Avoid logical || since it results in a branch */
    bad |= padding_len > input_len;
    bad |= padding_len == 0;

    /* The number of bytes checked must be independent of padding_len,
     * so pick input_len, which is usually 8 or 16 (one block) */
    pad_idx = input_len - padding_len;
    for( i = 0; i < input_len; i++ )
        bad |= ( input[i] ^ padding_len ) * ( i >= pad_idx );

    return( MBEDTLS_ERR_CIPHER_INVALID_PADDING * ( bad != 0 ) );
}